

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *v)

{
  ulong uVar1;
  pointer pqVar2;
  long lVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pqVar2 = (v->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      operator<<(os,(quath *)((long)&(pqVar2->imag)._M_elems[0].value + lVar3));
      pqVar2 = (v->
               super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = (long)(v->
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pqVar2 >> 3;
      if (uVar4 != uVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        pqVar2 = (v->
                 super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar1 = (long)(v->
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pqVar2 >> 3;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar4 < uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}